

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerImpl::SignRequest
          (Error *__return_storage_ptr__,CommissionerImpl *this,Request *aRequest,Scope aScope,
          bool aAppendToken)

{
  bool bVar1;
  uint uVar2;
  Error *pEVar3;
  ByteArray *aValue;
  ErrorCode local_124;
  Tlv local_120;
  Error local_100;
  ErrorCode local_d4;
  Tlv local_d0;
  Error local_b0;
  ErrorCode local_84;
  Error local_80;
  byte local_41;
  undefined1 local_40 [7];
  bool condition;
  ByteArray signature;
  bool aAppendToken_local;
  Scope aScope_local;
  Request *aRequest_local;
  CommissionerImpl *this_local;
  Error *error;
  
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = aAppendToken;
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = aScope;
  Error::Error(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
  local_41 = (byte)uVar2 & 1;
  if ((uVar2 & 1) == 0) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                  ,0x5a0,
                  "Error ot::commissioner::CommissionerImpl::SignRequest(coap::Request &, tlv::Scope, bool)"
                 );
  }
  TokenManager::SignMessage(&local_80,&this->mTokenManager,(ByteArray *)local_40,aRequest);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_80);
  local_84 = kNone;
  bVar1 = commissioner::operator!=(pEVar3,&local_84);
  Error::~Error(&local_80);
  if (!bVar1) {
    if ((signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      aValue = TokenManager::GetToken(&this->mTokenManager);
      tlv::Tlv::Tlv(&local_d0,kCommissionerToken,aValue,
                    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
      AppendTlv(&local_b0,aRequest,&local_d0);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_b0);
      local_d4 = kNone;
      bVar1 = commissioner::operator!=(pEVar3,&local_d4);
      Error::~Error(&local_b0);
      tlv::Tlv::~Tlv(&local_d0);
      if (bVar1) goto LAB_00268bac;
    }
    tlv::Tlv::Tlv(&local_120,kCommissionerSignature,(ByteArray *)local_40,
                  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
    AppendTlv(&local_100,aRequest,&local_120);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_100);
    local_124 = kNone;
    commissioner::operator!=(pEVar3,&local_124);
    Error::~Error(&local_100);
    tlv::Tlv::~Tlv(&local_120);
  }
LAB_00268bac:
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if ((signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::SignRequest(coap::Request &aRequest, tlv::Scope aScope, bool aAppendToken)
{
    Error     error;
    ByteArray signature;

    ASSERT(IsCcmMode());

    SuccessOrExit(error = mTokenManager.SignMessage(signature, aRequest));

    if (aAppendToken)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerToken, mTokenManager.GetToken(), aScope}));
    }
    SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerSignature, signature, aScope}));

exit:
    return error;
}